

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<float,_double>::Run
          (DataTransform<float,_double> *this,istream *input_stream)

{
  double dVar1;
  double dVar2;
  NumericType NVar3;
  WarningType WVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar13;
  double data_to_write;
  float input_data;
  string word;
  char buffer [128];
  float local_288;
  float local_284;
  string local_280;
  string *local_260;
  double local_258;
  double local_250;
  double local_248;
  undefined8 uStack_240;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_260 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar11 = 2;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        iVar11 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_280);
        if (local_280._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_0014049f:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar11;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_0014049f;
        }
        local_288 = (float)in_ST0;
        iVar11 = 0;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar5) {
LAB_00140141:
        dVar13 = (double)local_288;
        dVar1 = this->minimum_value_;
        dVar2 = this->maximum_value_;
        bVar5 = true;
        data_to_write = dVar13;
        if (dVar1 < dVar2) {
          NVar3 = this->input_numeric_type_;
          if (NVar3 == kFloatingPoint) {
            local_284 = local_288;
            in_ST6 = in_ST5;
            in_ST7 = in_ST5;
            local_250 = dVar1;
            if ((float)dVar1 <= local_288) {
              local_258 = dVar2;
              if ((float)dVar2 < local_288) {
LAB_00140253:
                bVar5 = false;
                data_to_write = dVar2;
              }
            }
            else {
LAB_0014023a:
              bVar5 = false;
              data_to_write = dVar1;
            }
          }
          else if (NVar3 == kUnsignedInteger) {
            uVar10 = (long)(local_288 - 9.223372e+18) & (long)local_288 >> 0x3f | (long)local_288;
            if (uVar10 < (ulong)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                                (long)dVar1)) goto LAB_0014023a;
            if ((ulong)((long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2) <
                uVar10) goto LAB_00140253;
          }
          else if (NVar3 == kSignedInteger) {
            if ((long)local_288 < (long)dVar1) goto LAB_0014023a;
            if ((long)dVar2 < (long)local_288) goto LAB_00140253;
          }
        }
        if ((bVar5) && (this->rounding_ != false)) {
          if (local_288 <= 0.0) {
            data_to_write = dVar13 + -0.5;
          }
          else {
            data_to_write = dVar13 + 0.5;
          }
        }
        if (!(bool)(bVar5 | this->warning_type_ == kIgnore)) {
          uStack_240 = 0;
          local_248 = data_to_write;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"x2x","");
          sptk::PrintErrorMessage(&local_280,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar11 = 1;
          data_to_write = local_248;
          if (WVar4 == kExit) goto LAB_001403f2;
        }
        if (this->is_ascii_output_ == true) {
          bVar5 = sptk::SnPrintf<double>(data_to_write,local_260,0x80,local_b8);
          iVar11 = 1;
          if (bVar5) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if ((iVar12 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_001403f0:
            iVar11 = 0;
          }
        }
        else {
          bVar5 = sptk::WriteStream<double>(data_to_write,(ostream *)&std::cout);
          iVar11 = 1;
          if (bVar5) goto LAB_001403f0;
        }
      }
    }
    else {
      bVar5 = sptk::ReadStream<float>(&local_288,input_stream);
      iVar11 = 2;
      if (bVar5) goto LAB_00140141;
    }
LAB_001403f2:
    if (iVar11 != 0) {
      if (iVar11 == 2) {
        bVar5 = true;
        if ((this->is_ascii_output_ == true) && (iVar12 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar5 = false;
      }
      return bVar5;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }